

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  pointer __s1;
  size_t __n;
  size_t __n_00;
  pointer __s1_00;
  int iVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  
  pcVar2 = this->Parent;
  if (pcVar2 != (cmGeneratorExpressionDAGChecker *)0x0) {
    __s1 = (this->Target)._M_dataplus._M_p;
    __n = (this->Target)._M_string_length;
    __n_00 = (this->Property)._M_string_length;
    __s1_00 = (this->Property)._M_dataplus._M_p;
    do {
      if (((__n == (pcVar2->Target)._M_string_length) &&
          (((__n == 0 || (iVar1 = bcmp(__s1,(pcVar2->Target)._M_dataplus._M_p,__n), iVar1 == 0)) &&
           (__n_00 == (pcVar2->Property)._M_string_length)))) &&
         ((__n_00 == 0 ||
          (iVar1 = bcmp(__s1_00,(pcVar2->Property)._M_dataplus._M_p,__n_00), iVar1 == 0)))) {
        return (pcVar2 != this->Parent) + SELF_REFERENCE;
      }
      pcVar2 = pcVar2->Parent;
    } while (pcVar2 != (cmGeneratorExpressionDAGChecker *)0x0);
  }
  return DAG;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker *parent = this->Parent;
  while (parent)
    {
    if (this->Target == parent->Target && this->Property == parent->Property)
      {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
      }
    parent = parent->Parent;
    }
  return DAG;
}